

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O0

void __thiscall npas4_Report_Test::npas4_Report_Test(npas4_Report_Test *this)

{
  npas4_Report_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__npas4_Report_Test_0018bf00;
  return;
}

Assistant:

TEST(npas4, Report)
{
	EXPECT_NE(int64_t(0), npas4::GetRAMSystemTotal());
	EXPECT_NE(int64_t(0), npas4::GetRAMSystemAvailable());
	EXPECT_NE(int64_t(0), npas4::GetRAMSystemUsed());
	EXPECT_NE(int64_t(0), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_NE(int64_t(0), npas4::GetRAMPhysicalTotal());
	EXPECT_NE(int64_t(0), npas4::GetRAMPhysicalAvailable());
	EXPECT_NE(int64_t(0), npas4::GetRAMPhysicalUsed());
	EXPECT_NE(int64_t(0), npas4::GetRAMPhysicalUsedByCurrentProcess());
}